

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_is_num(char *buff)

{
  char *pcVar1;
  size_t sVar2;
  ushort **ppuVar3;
  size_t sVar4;
  
  sVar2 = strlen(buff);
  sVar4 = 0;
  do {
    if (sVar2 == sVar4) {
      return '\x01';
    }
    ppuVar3 = __ctype_b_loc();
    pcVar1 = buff + sVar4;
    sVar4 = sVar4 + 1;
  } while (((long)*pcVar1 == 0x2d) || (((*ppuVar3)[*pcVar1] & 0x800) != 0));
  return '\0';
}

Assistant:

static HTS_Boolean HTS_is_num(const char *buff)
{
   size_t i;
   size_t length = strlen(buff);

   for (i = 0; i < length; i++)
      if (!(isdigit((int) buff[i]) || (buff[i] == '-')))
         return FALSE;

   return TRUE;
}